

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QVariant>_>::Data
          (Data<QHashPrivate::Node<int,_QVariant>_> *this,
          Data<QHashPrivate::Node<int,_QVariant>_> *other)

{
  Span *pSVar1;
  Entry *pEVar2;
  anon_struct_40_1_898a9ca8_for_storage *paVar3;
  ulong uVar4;
  Node<int,_QVariant> *pNVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  R RVar9;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar7 = other->numBuckets;
  sVar8 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar8;
  this->spans = (Span *)0x0;
  RVar9 = allocateSpans(sVar7);
  this->spans = (Span *)RVar9.spans;
  if (RVar9.nSpans != 0) {
    lVar6 = 0;
    sVar7 = 0;
    do {
      pSVar1 = other->spans;
      sVar8 = 0;
      do {
        uVar4 = (ulong)pSVar1->offsets[sVar8 + lVar6];
        if (uVar4 != 0xff) {
          pEVar2 = pSVar1[sVar7].entries;
          pNVar5 = Span<QHashPrivate::Node<int,_QVariant>_>::insert(this->spans + sVar7,sVar8);
          paVar3 = &pEVar2[uVar4].storage;
          pNVar5->key = *(int *)paVar3->data;
          QVariant::QVariant(&pNVar5->value,(QVariant *)(paVar3->data + 8));
        }
        sVar8 = sVar8 + 1;
      } while (sVar8 != 0x80);
      sVar7 = sVar7 + 1;
      lVar6 = lVar6 + 0x90;
    } while (sVar7 != RVar9.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }